

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

bool __thiscall flexbuffers::Reference::MutateFloat(Reference *this,float f)

{
  uint8_t *dest;
  float f_local;
  Reference *this_local;
  
  if (this->type_ == FBT_FLOAT) {
    this_local._7_1_ = MutateF<float>(this,this->data_,f,(ulong)this->parent_width_,BIT_WIDTH_32);
  }
  else if (this->type_ == FBT_INDIRECT_FLOAT) {
    dest = Indirect(this);
    this_local._7_1_ = MutateF<float>(this,dest,f,(ulong)this->byte_width_,BIT_WIDTH_32);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MutateFloat(float f) {
    if (type_ == FBT_FLOAT) {
      return MutateF(data_, f, parent_width_, BIT_WIDTH_32);
    } else if (type_ == FBT_INDIRECT_FLOAT) {
      return MutateF(Indirect(), f, byte_width_, BIT_WIDTH_32);
    } else {
      return false;
    }
  }